

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_public_key_negate(uchar *pub_key,size_t pub_key_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  bool bVar2;
  size_t sStack_70;
  _Bool ok;
  size_t len_in_out;
  secp256k1_pubkey pub;
  size_t len_local;
  uchar *bytes_out_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  
  sStack_70 = 0x21;
  bVar2 = false;
  pub.data._56_8_ = len;
  if ((((pub_key != (uchar *)0x0) && (bVar2 = false, pub_key_len == 0x21)) &&
      (bVar2 = false, bytes_out != (uchar *)0x0)) && (bVar2 = false, len == 0x21)) {
    iVar1 = pubkey_parse((secp256k1_pubkey *)&len_in_out,pub_key,0x21);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = pubkey_negate((secp256k1_pubkey *)&len_in_out);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = pubkey_serialize(bytes_out,&stack0xffffffffffffff90,(secp256k1_pubkey *)&len_in_out,
                                 0x102);
        bVar2 = false;
        if (iVar1 != 0) {
          bVar2 = sStack_70 == 0x21;
        }
      }
    }
  }
  if ((!bVar2) && (bytes_out != (uchar *)0x0)) {
    wally_clear(bytes_out,pub.data._56_8_);
  }
  wally_clear(&len_in_out,0x40);
  iVar1 = -2;
  if (bVar2) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_ec_public_key_negate(const unsigned char *pub_key, size_t pub_key_len,
                               unsigned char *bytes_out, size_t len)
{
    secp256k1_pubkey pub;
    size_t len_in_out = EC_PUBLIC_KEY_LEN;
    bool ok;

    ok = pub_key && pub_key_len == EC_PUBLIC_KEY_LEN &&
         bytes_out && len == EC_PUBLIC_KEY_LEN &&
         pubkey_parse(&pub, pub_key, pub_key_len) &&
         pubkey_negate(&pub) &&
         pubkey_serialize(bytes_out, &len_in_out, &pub, PUBKEY_COMPRESSED) &&
         len_in_out == EC_PUBLIC_KEY_LEN;

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    wally_clear(&pub, sizeof(pub));
    return ok ? WALLY_OK : WALLY_EINVAL;
}